

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

BUFFER_HANDLE constructPublishReply(CONTROL_PACKET_TYPE type,uint8_t flags,uint16_t packetId)

{
  int iVar1;
  BUFFER_HANDLE handle;
  byte *pbVar2;
  
  handle = BUFFER_new();
  if (handle != (BUFFER_HANDLE)0x0) {
    iVar1 = BUFFER_pre_build(handle,4);
    if ((iVar1 == 0) && (pbVar2 = BUFFER_u_char(handle), pbVar2 != (byte *)0x0)) {
      *pbVar2 = (byte)type | flags;
      pbVar2[1] = 2;
      pbVar2[2] = (byte)(packetId >> 8);
      pbVar2[3] = (byte)packetId;
      return handle;
    }
    BUFFER_delete(handle);
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

static BUFFER_HANDLE constructPublishReply(CONTROL_PACKET_TYPE type, uint8_t flags, uint16_t packetId)
{
    BUFFER_HANDLE result = BUFFER_new();
    if (result != NULL)
    {
        if (BUFFER_pre_build(result, 4) != 0)
        {
            BUFFER_delete(result);
            result = NULL;
        }
        else
        {
            uint8_t* iterator = BUFFER_u_char(result);
            if (iterator == NULL)
            {
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                *iterator = (uint8_t)type | flags;
                iterator++;
                *iterator = 0x2;
                iterator++;
                byteutil_writeInt(&iterator, packetId);
            }
        }
    }
    return result;
}